

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

void __thiscall
slang::ast::SimpleAssertionExpr::requireSequence
          (SimpleAssertionExpr *this,ASTContext *context,DiagCode code)

{
  Expression *pEVar1;
  Type *this_00;
  Type *pTVar2;
  SourceRange sourceRange;
  
  pEVar1 = this->expr;
  if (pEVar1->kind != AssertionInstance) {
    return;
  }
  this_00 = (pEVar1->type).ptr;
  pTVar2 = this_00->canonical;
  if (pTVar2 == (Type *)0x0) {
    Type::resolveCanonical(this_00);
    pTVar2 = this_00->canonical;
  }
  if ((pTVar2->super_Symbol).kind == PropertyType) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange((this->super_AssertionExpr).syntax);
    ASTContext::addDiag(context,code,sourceRange);
    return;
  }
  AssertionExpr::requireSequence((AssertionExpr *)pEVar1[1].type.ptr,context,code);
  return;
}

Assistant:

void SimpleAssertionExpr::requireSequence(const ASTContext& context, DiagCode code) const {
    if (expr.kind == ExpressionKind::AssertionInstance) {
        auto& aie = expr.as<AssertionInstanceExpression>();
        if (aie.type->isPropertyType()) {
            SLANG_ASSERT(syntax);
            context.addDiag(code, syntax->sourceRange());
            return;
        }

        aie.body.requireSequence(context, code);
    }
}